

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O3

BoundLimitNode * __thiscall
duckdb::Binder::BindLimitValue
          (BoundLimitNode *__return_storage_ptr__,Binder *this,OrderBinder *order_binder,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *limit_val,bool is_percentage,bool is_offset)

{
  ClientContext *pCVar1;
  optional_idx error_location;
  undefined8 uVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  int iVar6;
  type pBVar7;
  pointer pPVar8;
  pointer pEVar9;
  type expr;
  Binder *pBVar10;
  int64_t value;
  BinderException *pBVar11;
  OutOfRangeException *this_00;
  BoundLimitNode *__return_storage_ptr___00;
  pointer *__ptr;
  undefined3 in_register_00000089;
  Value val;
  shared_ptr<duckdb::Binder,_true> new_binder;
  undefined1 local_188 [16];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_178;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_170;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_168;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_160;
  Binder *local_158;
  Binder *local_150;
  ClientContext *local_148;
  undefined1 local_140 [16];
  undefined1 auStack_130 [48];
  undefined1 local_100 [16];
  undefined1 local_f0 [64];
  LogicalType local_b0;
  ExpressionBinder local_98;
  
  local_148 = (ClientContext *)CONCAT44(local_148._4_4_,CONCAT31(in_register_00000089,is_offset));
  local_188._8_8_ = __return_storage_ptr__;
  CreateBinder((Binder *)local_100,this->context,(optional_ptr<duckdb::Binder,_true>)this,
               REGULAR_BINDER);
  pBVar7 = shared_ptr<duckdb::Binder,_true>::operator*
                     ((shared_ptr<duckdb::Binder,_true> *)local_100);
  ExpressionBinder::ExpressionBinder(&local_98,pBVar7,this->context,false);
  LogicalType::LogicalType((LogicalType *)local_140,is_percentage * '\t' + BIGINT);
  _Var4._M_pi = local_98.target_type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar3 = local_98.target_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar2 = local_140._0_8_;
  local_98.target_type.id_ = local_140[0];
  local_98.target_type.physical_type_ = local_140[1];
  local_98.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_140._8_8_;
  local_98.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_130._0_8_;
  local_140._8_8_ = peVar3;
  auStack_130._0_8_ = _Var4._M_pi;
  local_140._0_8_ = uVar2;
  LogicalType::~LogicalType((LogicalType *)local_140);
  pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(limit_val);
  (*(pPVar8->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_150,pPVar8);
  ExpressionBinder::Bind
            ((ExpressionBinder *)local_188,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_98,(optional_ptr<duckdb::LogicalType,_true>)limit_val,false);
  pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)local_188);
  iVar6 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[4])(pEVar9);
  if ((char)iVar6 == '\0') {
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)local_188);
    iVar6 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar9);
    if ((char)iVar6 == '\0') {
      pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)local_100);
      if ((pBVar10->correlated_columns).
          super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
          super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pBVar10->correlated_columns).
          super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
          super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
        local_140._0_8_ = local_140 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_140,"Correlated columns not supported in LIMIT/OFFSET","");
        BinderException::BinderException(pBVar11,(string *)local_140);
        __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pBVar7 = shared_ptr<duckdb::Binder,_true>::operator*
                         ((shared_ptr<duckdb::Binder,_true> *)local_100);
      MoveCorrelatedExpressions(this,pBVar7);
      __return_storage_ptr___00 = (BoundLimitNode *)local_188._8_8_;
      if (is_percentage) {
        local_170._M_head_impl = (Expression *)local_188._0_8_;
        local_188._0_8_ = (Expression *)0x0;
        BoundLimitNode::ExpressionPercentage
                  ((BoundLimitNode *)local_188._8_8_,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_170);
        if (local_170._M_head_impl != (Expression *)0x0) {
          (*((local_170._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_170._M_head_impl = (Expression *)0x0;
      }
      else {
        local_178._M_head_impl = (Expression *)local_188._0_8_;
        local_188._0_8_ = (Expression *)0x0;
        BoundLimitNode::ExpressionValue
                  ((BoundLimitNode *)local_188._8_8_,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_178);
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_178._M_head_impl != (Expression *)0x0) {
          (*((local_178._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_178._M_head_impl = (Expression *)0x0;
      }
    }
    else {
      pCVar1 = this->context;
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_188);
      ExpressionExecutor::EvaluateScalar((Value *)local_f0,pCVar1,expr,false);
      pCVar1 = this->context;
      LogicalType::LogicalType(&local_b0,is_percentage * '\t' + BIGINT);
      Value::CastAs((Value *)local_140,(Value *)local_f0,pCVar1,&local_b0,false);
      LogicalType::~LogicalType(&local_b0);
      Value::~Value((Value *)local_f0);
      __return_storage_ptr___00 = (BoundLimitNode *)local_188._8_8_;
      if (is_percentage) {
        if ((bool)auStack_130[8] == false) {
          local_148 = (ClientContext *)Value::GetValue<double>((Value *)local_140);
        }
        else {
          local_148 = (ClientContext *)0x4059000000000000;
        }
        bVar5 = Value::IsNan<double>((double)local_148);
        if ((100.0 < (double)local_148) || (bVar5 || (double)local_148 < 0.0)) {
          this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_f0._0_8_ = local_f0 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f0,"Limit percent out of range, should be between 0% and 100%",
                     "");
          OutOfRangeException::OutOfRangeException(this_00,(string *)local_f0);
          __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        BoundLimitNode::ConstantPercentage(__return_storage_ptr___00,(double)local_148);
      }
      else {
        if ((bool)auStack_130[8] == false) {
          value = Value::GetValue<long>((Value *)local_140);
          if (value < 0) {
            pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
            pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                 *)local_188);
            error_location.index = (pEVar9->super_BaseExpression).query_location.index;
            local_f0._0_8_ = local_f0 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f0,"LIMIT/OFFSET cannot be negative","");
            BinderException::BinderException<>(pBVar11,error_location,(string *)local_f0);
            __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        else {
          value = 0x7fffffffffffffff;
          if ((char)local_148 != '\0') {
            value = 0;
          }
        }
        BoundLimitNode::ConstantValue(__return_storage_ptr___00,value);
      }
      Value::~Value((Value *)local_140);
    }
  }
  else {
    if ((order_binder->extra_list).ptr ==
        (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
         *)0x0) {
      pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
      local_140._0_8_ = local_140 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_140,"Subquery in LIMIT/OFFSET not supported in set operation","");
      BinderException::BinderException(pBVar11,(string *)local_140);
      __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_158 = local_150;
    local_150 = (Binder *)0x0;
    OrderBinder::CreateExtraReference
              ((OrderBinder *)local_140,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)order_binder);
    if (local_158 != (Binder *)0x0) {
      (*(code *)(((local_158->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    __return_storage_ptr___00 = (BoundLimitNode *)local_188._8_8_;
    local_158 = (Binder *)0x0;
    if (is_percentage) {
      local_160._M_head_impl = (Expression *)local_140._0_8_;
      local_140._0_8_ = (DummyBinding *)0x0;
      BoundLimitNode::ExpressionPercentage
                ((BoundLimitNode *)local_188._8_8_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_160);
      if ((DummyBinding *)local_160._M_head_impl != (DummyBinding *)0x0) {
        (*((Binding *)&(local_160._M_head_impl)->super_BaseExpression)->_vptr_Binding[1])();
      }
      local_160._M_head_impl = (Expression *)0x0;
    }
    else {
      local_168._M_head_impl = (Expression *)local_140._0_8_;
      local_140._0_8_ = (DummyBinding *)0x0;
      BoundLimitNode::ExpressionValue
                ((BoundLimitNode *)local_188._8_8_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_168);
      if ((DummyBinding *)local_168._M_head_impl != (DummyBinding *)0x0) {
        (*((Binding *)&(local_168._M_head_impl)->super_BaseExpression)->_vptr_Binding[1])();
      }
      local_168._M_head_impl = (Expression *)0x0;
    }
    if ((DummyBinding *)local_140._0_8_ != (DummyBinding *)0x0) {
      (**(code **)(*(long *)local_140._0_8_ + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
      local_188._0_8_ != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_188._0_8_ + 8))();
  }
  if (local_150 != (Binder *)0x0) {
    (*(code *)(((local_150->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  ExpressionBinder::~ExpressionBinder(&local_98);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
  }
  return __return_storage_ptr___00;
}

Assistant:

BoundLimitNode Binder::BindLimitValue(OrderBinder &order_binder, unique_ptr<ParsedExpression> limit_val,
                                      bool is_percentage, bool is_offset) {
	auto new_binder = Binder::CreateBinder(context, this);
	ExpressionBinder expr_binder(*new_binder, context);
	auto target_type = is_percentage ? LogicalType::DOUBLE : LogicalType::BIGINT;
	expr_binder.target_type = target_type;
	auto original_limit = limit_val->Copy();
	auto expr = expr_binder.Bind(limit_val);
	if (expr->HasSubquery()) {
		if (!order_binder.HasExtraList()) {
			throw BinderException("Subquery in LIMIT/OFFSET not supported in set operation");
		}
		auto bound_limit = order_binder.CreateExtraReference(std::move(original_limit));
		if (is_percentage) {
			return BoundLimitNode::ExpressionPercentage(std::move(bound_limit));
		} else {
			return BoundLimitNode::ExpressionValue(std::move(bound_limit));
		}
	}
	if (expr->IsFoldable()) {
		//! this is a constant
		auto val = ExpressionExecutor::EvaluateScalar(context, *expr).CastAs(context, target_type);
		if (is_percentage) {
			D_ASSERT(!is_offset);
			double percentage_val;
			if (val.IsNull()) {
				percentage_val = 100.0;
			} else {
				percentage_val = val.GetValue<double>();
			}
			if (Value::IsNan(percentage_val) || percentage_val < 0 || percentage_val > 100) {
				throw OutOfRangeException("Limit percent out of range, should be between 0% and 100%");
			}
			return BoundLimitNode::ConstantPercentage(percentage_val);
		} else {
			int64_t constant_val;
			if (val.IsNull()) {
				constant_val = is_offset ? 0 : NumericLimits<int64_t>::Maximum();
			} else {
				constant_val = val.GetValue<int64_t>();
			}
			if (constant_val < 0) {
				throw BinderException(expr->GetQueryLocation(), "LIMIT/OFFSET cannot be negative");
			}
			return BoundLimitNode::ConstantValue(constant_val);
		}
	}
	if (!new_binder->correlated_columns.empty()) {
		throw BinderException("Correlated columns not supported in LIMIT/OFFSET");
	}
	// move any correlated columns to this binder
	MoveCorrelatedExpressions(*new_binder);
	if (is_percentage) {
		return BoundLimitNode::ExpressionPercentage(std::move(expr));
	} else {
		return BoundLimitNode::ExpressionValue(std::move(expr));
	}
}